

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLDeclaration::ParseDeep(XMLDeclaration *this,char *p,StrPair *param_2)

{
  XMLDocument *pXVar1;
  char *pcVar2;
  
  pcVar2 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"?>",2);
  if (pcVar2 == (char *)0x0) {
    pXVar1 = (this->super_XMLNode)._document;
    pXVar1->_errorID = XML_ERROR_PARSING_DECLARATION;
    pXVar1->_errorStr1 = p;
    pXVar1->_errorStr2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char* XMLDeclaration::ParseDeep( char* p, StrPair* )
{
    // Declaration parses as text.
    const char* start = p;
    p = _value.ParseText( p, "?>", StrPair::NEEDS_NEWLINE_NORMALIZATION );
    if ( p == 0 ) {
        _document->SetError( XML_ERROR_PARSING_DECLARATION, start, 0 );
    }
    return p;
}